

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

bool __thiscall
f8n::runtime::MessageQueue::Contains(MessageQueue *this,IMessageTarget *target,int type)

{
  int iVar1;
  undefined4 extraout_var;
  _List_node_base *p_Var2;
  IMessagePtr current;
  LockT lock;
  __shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> local_50;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->queueMutex);
  p_Var2 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)&this->queue) {
LAB_001cffbb:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return p_Var2 != (_List_node_base *)&this->queue;
    }
    std::__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_next
              );
    iVar1 = (*(local_50._M_ptr)->_vptr_IMessage[2])();
    if ((IMessageTarget *)CONCAT44(extraout_var,iVar1) == target) {
      if (type != -1) {
        iVar1 = (*(local_50._M_ptr)->_vptr_IMessage[3])();
        if (iVar1 != type) goto LAB_001cffa5;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      goto LAB_001cffbb;
    }
LAB_001cffa5:
    p_Var2 = p_Var2->_M_next;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  } while( true );
}

Assistant:

bool MessageQueue::Contains(IMessageTarget *target, int type) {
    LockT lock(this->queueMutex);

    std::list<EnqueuedMessage*>::iterator it = this->queue.begin();
    while (it != this->queue.end()) {
        IMessagePtr current = (*it)->message;

        if (current->Target() == target) {
            if (type == -1 || type == current->Type()) {
                return true;
            }
        }

        ++it;
    }
    return false;
}